

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::upsample(Mesh *this)

{
  bool bVar1;
  pointer this_00;
  Size SVar2;
  ostream *poVar3;
  pointer pVVar4;
  pointer pVVar5;
  _Self local_48;
  _Self local_40;
  VertexIter v;
  iterator local_30;
  _List_const_iterator<CMU462::Face> local_28;
  iterator local_20;
  _List_const_iterator<CMU462::Face> local_18;
  FaceCIter f;
  Mesh *this_local;
  
  f._M_node = (_List_node_base *)this;
  local_20._M_node = (_List_node_base *)HalfedgeMesh::facesBegin(&this->mesh);
  std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_18,&local_20);
  while( true ) {
    local_30._M_node = (_List_node_base *)HalfedgeMesh::facesEnd(&this->mesh);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_28,&local_30);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) {
      MeshResampler::upsample((MeshResampler *)&this->field_0x1e8,&this->mesh);
      local_40._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
      while( true ) {
        local_48._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(&this->mesh);
        bVar1 = std::operator!=(&local_40,&local_48);
        if (!bVar1) break;
        pVVar4 = std::_List_iterator<CMU462::Vertex>::operator->(&local_40);
        pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->(&local_40);
        (pVVar5->bindPosition).x = (pVVar4->position).x;
        (pVVar5->bindPosition).y = (pVVar4->position).y;
        (pVVar5->bindPosition).z = (pVVar4->position).z;
        std::_List_iterator<CMU462::Vertex>::operator++(&local_40,0);
      }
      Selection::clear(&((this->super_SceneObject).scene)->selected);
      Selection::clear(&((this->super_SceneObject).scene)->hovered);
      Selection::clear(&((this->super_SceneObject).scene)->elementTransform->target);
      return;
    }
    this_00 = std::_List_const_iterator<CMU462::Face>::operator->(&local_18);
    SVar2 = Face::degree(this_00);
    if (SVar2 != 3) break;
    v._M_node = (_List_node_base *)std::_List_const_iterator<CMU462::Face>::operator++(&local_18,0);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "Warning: refusing to apply Loop subdivision to surface with non-triangular faces!"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cerr,"(Try triangulating first.)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Mesh::upsample()
{
   for( FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++ )
   {
      if( f->degree() != 3 )
      {
         cerr << "Warning: refusing to apply Loop subdivision to surface with non-triangular faces!" << endl;
         cerr << "(Try triangulating first.)" << endl;
         return;
      }
   }
   resampler.upsample(mesh);
   // Make sure the bind position is set
   for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++)
   {
     v->bindPosition = v->position;
   }
   scene->selected.clear();
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}